

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

float __thiscall
glu::TextureTestUtil::computeNonProjectedTriLod
          (TextureTestUtil *this,LodMode mode,IVec2 *dstSize,deInt32 srcSize,Vec3 *sq)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  fVar4 = 0.0;
  if ((uint)this < 3) {
    fVar3 = (float)srcSize;
    auVar6._0_4_ = (float)(int)dstSize;
    auVar6._4_4_ = (float)(int)mode;
    auVar6._8_8_ = 0;
    fVar4 = sq->m_data[0];
    auVar5._0_4_ = fVar3 * ((float)*(undefined8 *)(sq->m_data + 1) - fVar4);
    auVar5._4_4_ = fVar3 * ((float)((ulong)*(undefined8 *)(sq->m_data + 1) >> 0x20) - fVar4);
    auVar5._8_4_ = fVar3 * (0.0 - fVar4);
    auVar5._12_4_ = fVar3 * (0.0 - fVar4);
    auVar5 = divps(auVar5,auVar6);
    fVar4 = auVar5._0_4_;
    fVar3 = auVar5._4_4_;
    uVar1 = -(uint)(-fVar4 <= fVar4);
    uVar2 = -(uint)(-fVar3 <= fVar3);
    fVar4 = (float)(~uVar1 & (uint)-fVar4 | (uint)fVar4 & uVar1);
    fVar3 = (float)(~uVar2 & (uint)-fVar3 | (uint)fVar3 & uVar2);
    uVar1 = -(uint)(fVar4 <= fVar3);
    fVar4 = (float)(~uVar1 & (uint)fVar4 | (uint)fVar3 & uVar1);
  }
  fVar4 = logf(fVar4);
  return fVar4 * 1.442695;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, deInt32 srcSize, const tcu::Vec3& sq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize;
	float duy	= (sq.y() - sq.x()) * (float)srcSize;
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, duy/dy);
}